

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboTestCase.cpp
# Opt level: O2

void __thiscall deqp::gles3::Functional::FboTestCase::checkError(FboTestCase *this)

{
  deUint32 error;
  Error *this_00;
  allocator<char> local_91;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  code *local_30;
  deUint32 local_28;
  
  error = sglr::ContextWrapper::glGetError(&this->super_ContextWrapper);
  if (error == 0) {
    return;
  }
  this_00 = (Error *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"Got ",&local_91);
  local_30 = glu::getErrorName;
  local_28 = error;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_90,&local_30);
  std::operator+(&local_50,&local_70,&local_90);
  glu::Error::Error(this_00,error,local_50._M_dataplus._M_p,(char *)0x0,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFboTestCase.cpp"
                    ,0x94);
  __cxa_throw(this_00,&glu::Error::typeinfo,glu::Error::~Error);
}

Assistant:

void FboTestCase::checkError (void)
{
	deUint32 err = glGetError();
	if (err != GL_NO_ERROR)
		throw glu::Error((int)err, (string("Got ") + glu::getErrorStr(err).toString()).c_str(), DE_NULL, __FILE__, __LINE__);
}